

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::HeapprofdConfig::ParseFromArray(HeapprofdConfig *this,void *raw,size_t size)

{
  pointer puVar1;
  uint64_t uVar2;
  undefined1 uVar3;
  uint uVar4;
  uint64_t *puVar5;
  uint64_t *puVar6;
  uint64_t *puVar7;
  uint64_t uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t *end;
  ulong uVar11;
  uint64_t preamble;
  uint32_t local_a0;
  ushort local_9c;
  uint8_t local_9a;
  uint64_t int_value;
  uint64_t payload_length;
  HeapprofdConfig *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  bitset<28UL> *local_40;
  uint64_t payload_length_1;
  
  local_48 = &this->process_cmdline_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_48);
  puVar1 = (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  local_50 = &this->target_installed_by_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_50);
  local_58 = &this->heaps_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_58);
  local_60 = &this->exclude_heaps_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_60);
  puVar1 = (this->heap_sampling_intervals_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->heap_sampling_intervals_).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->heap_sampling_intervals_).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  local_68 = &this->pid_;
  local_70 = &this->heap_sampling_intervals_;
  local_78 = &this->skip_symbol_prefix_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_78);
  local_80 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  end = (uint64_t *)(size + (long)raw);
  uVar10 = 0;
  local_88 = this;
  while( true ) {
    if (end <= raw) {
      uVar8 = 0;
      goto LAB_002bbab8;
    }
    preamble = 0;
    if ((long)(char)*raw < 0) break;
    puVar7 = (uint64_t *)((long)raw + 1);
    preamble = (long)(char)*raw;
LAB_002bb96c:
    uVar2 = preamble;
    uVar11 = preamble >> 3;
    uVar4 = (uint)uVar11;
    if ((uVar4 == 0) || (end <= puVar7)) goto LAB_002bbe89;
    int_value = 0;
    switch((uint)preamble & 7) {
    case 0:
      puVar6 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar7,(uint8_t *)end,&int_value);
      uVar9 = 0;
      uVar8 = 0;
      if (puVar6 == puVar7) goto LAB_002bbab8;
      break;
    case 1:
      puVar6 = puVar7 + 1;
      if (end < puVar6) goto switchD_002bb9a4_caseD_3;
      int_value = *puVar7;
LAB_002bb9f2:
      uVar9 = 0;
      break;
    case 2:
      puVar5 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar7,(uint8_t *)end,&payload_length)
      ;
      if ((puVar5 == puVar7) || ((ulong)((long)end - (long)puVar5) < payload_length))
      goto switchD_002bb9a4_caseD_3;
      puVar6 = (uint64_t *)((long)puVar5 + payload_length);
      uVar9 = payload_length;
      int_value = (uint64_t)puVar5;
      break;
    default:
      goto switchD_002bb9a4_caseD_3;
    case 5:
      puVar6 = (uint64_t *)((long)puVar7 + 4);
      if (puVar6 <= end) {
        int_value = (uint64_t)(uint)*puVar7;
        goto LAB_002bb9f2;
      }
      goto switchD_002bb9a4_caseD_3;
    }
    raw = puVar6;
    if ((uVar4 < 0x10000) && (uVar9 < 0x10000000)) {
      uVar10 = uVar9 | (uVar2 & 7) << 0x30 | uVar11 << 0x20;
      uVar8 = int_value;
LAB_002bbab8:
      local_40 = &local_88->_has_field_;
LAB_002bbaca:
      do {
        preamble = uVar8;
        local_a0 = (uint32_t)uVar10;
        local_9a = (uint8_t)(uVar10 >> 0x30);
        uVar4 = (uint)(uVar10 >> 0x20);
        local_9c = (ushort)(uVar10 >> 0x20);
        if (local_9c == 0) {
          return end == (uint64_t *)raw;
        }
        if (local_9c < 0x1c) {
          std::bitset<28UL>::set(local_40,(ulong)(uVar4 & 0x1f),true);
          uVar4 = (uint)local_9c;
        }
        uVar4 = (uVar4 & 0xffff) - 1;
        if (uVar4 < 0x1b) {
          uVar3 = (*(code *)(&DAT_00379b78 + *(int *)(&DAT_00379b78 + (ulong)uVar4 * 4)))();
          return (bool)uVar3;
        }
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                  ((Field *)&preamble,local_80);
        do {
          if (end <= raw) {
            uVar10 = 0;
            uVar8 = 0;
            goto LAB_002bbaca;
          }
          int_value = 0;
          if ((long)(char)*raw < 0) {
            puVar7 = (uint64_t *)
                     protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&int_value);
            if (puVar7 != (uint64_t *)raw) goto LAB_002bbce3;
LAB_002bbe5f:
            uVar10 = 0;
            uVar8 = 0;
            goto LAB_002bbaca;
          }
          puVar7 = (uint64_t *)((long)raw + 1);
          int_value = (long)(char)*raw;
LAB_002bbce3:
          uVar2 = int_value;
          uVar11 = int_value >> 3;
          uVar4 = (uint)uVar11;
          if ((uVar4 == 0) || (end <= puVar7)) goto LAB_002bbe5f;
          payload_length = 0;
          switch((uint)int_value & 7) {
          case 0:
            puVar6 = (uint64_t *)
                     protozero::proto_utils::ParseVarInt
                               ((uint8_t *)puVar7,(uint8_t *)end,&payload_length);
            uVar9 = 0;
            uVar10 = 0;
            uVar8 = 0;
            if (puVar6 == puVar7) goto LAB_002bbaca;
            break;
          case 1:
            puVar6 = puVar7 + 1;
            if (end < puVar6) goto switchD_002bbd23_caseD_3;
            payload_length = *puVar7;
LAB_002bbd7b:
            uVar9 = 0;
            break;
          case 2:
            puVar5 = (uint64_t *)
                     protozero::proto_utils::ParseVarInt
                               ((uint8_t *)puVar7,(uint8_t *)end,&payload_length_1);
            if ((puVar5 == puVar7) || ((ulong)((long)end - (long)puVar5) < payload_length_1))
            goto switchD_002bbd23_caseD_3;
            puVar6 = (uint64_t *)((long)puVar5 + payload_length_1);
            uVar9 = payload_length_1;
            payload_length = (uint64_t)puVar5;
            break;
          default:
            goto switchD_002bbd23_caseD_3;
          case 5:
            puVar6 = (uint64_t *)((long)puVar7 + 4);
            if (puVar6 <= end) {
              payload_length = (uint64_t)(uint)*puVar7;
              goto LAB_002bbd7b;
            }
            goto switchD_002bbd23_caseD_3;
          }
          raw = puVar6;
        } while ((0xffff < uVar4) || (0xfffffff < uVar9));
        uVar10 = uVar9 | (uVar2 & 7) << 0x30 | uVar11 << 0x20;
        uVar8 = payload_length;
      } while( true );
    }
  }
  puVar7 = (uint64_t *)protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&preamble);
  if (puVar7 != (uint64_t *)raw) goto LAB_002bb96c;
LAB_002bbe89:
  uVar10 = 0;
  uVar8 = 0;
  goto LAB_002bbab8;
switchD_002bb9a4_caseD_3:
  uVar10 = 0;
  uVar8 = 0;
  goto LAB_002bbab8;
switchD_002bbd23_caseD_3:
  uVar10 = 0;
  uVar8 = 0;
  goto LAB_002bbaca;
}

Assistant:

bool HeapprofdConfig::ParseFromArray(const void* raw, size_t size) {
  process_cmdline_.clear();
  pid_.clear();
  target_installed_by_.clear();
  heaps_.clear();
  exclude_heaps_.clear();
  heap_sampling_intervals_.clear();
  skip_symbol_prefix_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* sampling_interval_bytes */:
        field.get(&sampling_interval_bytes_);
        break;
      case 24 /* adaptive_sampling_shmem_threshold */:
        field.get(&adaptive_sampling_shmem_threshold_);
        break;
      case 25 /* adaptive_sampling_max_sampling_interval_bytes */:
        field.get(&adaptive_sampling_max_sampling_interval_bytes_);
        break;
      case 2 /* process_cmdline */:
        process_cmdline_.emplace_back();
        field.get(&process_cmdline_.back());
        break;
      case 4 /* pid */:
        pid_.emplace_back();
        field.get(&pid_.back());
        break;
      case 26 /* target_installed_by */:
        target_installed_by_.emplace_back();
        field.get(&target_installed_by_.back());
        break;
      case 20 /* heaps */:
        heaps_.emplace_back();
        field.get(&heaps_.back());
        break;
      case 27 /* exclude_heaps */:
        exclude_heaps_.emplace_back();
        field.get(&exclude_heaps_.back());
        break;
      case 23 /* stream_allocations */:
        field.get(&stream_allocations_);
        break;
      case 22 /* heap_sampling_intervals */:
        heap_sampling_intervals_.emplace_back();
        field.get(&heap_sampling_intervals_.back());
        break;
      case 21 /* all_heaps */:
        field.get(&all_heaps_);
        break;
      case 5 /* all */:
        field.get(&all_);
        break;
      case 15 /* min_anonymous_memory_kb */:
        field.get(&min_anonymous_memory_kb_);
        break;
      case 16 /* max_heapprofd_memory_kb */:
        field.get(&max_heapprofd_memory_kb_);
        break;
      case 17 /* max_heapprofd_cpu_secs */:
        field.get(&max_heapprofd_cpu_secs_);
        break;
      case 7 /* skip_symbol_prefix */:
        skip_symbol_prefix_.emplace_back();
        field.get(&skip_symbol_prefix_.back());
        break;
      case 6 /* continuous_dump_config */:
        (*continuous_dump_config_).ParseFromArray(field.data(), field.size());
        break;
      case 8 /* shmem_size_bytes */:
        field.get(&shmem_size_bytes_);
        break;
      case 9 /* block_client */:
        field.get(&block_client_);
        break;
      case 14 /* block_client_timeout_us */:
        field.get(&block_client_timeout_us_);
        break;
      case 10 /* no_startup */:
        field.get(&no_startup_);
        break;
      case 11 /* no_running */:
        field.get(&no_running_);
        break;
      case 13 /* dump_at_max */:
        field.get(&dump_at_max_);
        break;
      case 18 /* disable_fork_teardown */:
        field.get(&disable_fork_teardown_);
        break;
      case 19 /* disable_vfork_detection */:
        field.get(&disable_vfork_detection_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}